

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bb52cf::ProbModelXMLScopeFunctor::operator()(ProbModelXMLScopeFunctor *this)

{
  pointer pSVar1;
  FactoredDecPOMDPDiscrete *pFVar2;
  bool bVar3;
  int iVar4;
  ParserProbModelXML *this_00;
  xmlNodePtr pxVar5;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar6;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar7;
  vector<Scope,_std::allocator<Scope>_> *pvVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  EParse *this_01;
  elm_type eVar10;
  xmlNodeSetPtr pxVar11;
  ulong uVar12;
  xmlXPathContextPtr pxVar13;
  char *pcVar14;
  ParserProbModelXML *pPVar15;
  Index IVar16;
  long lVar17;
  xmlXPathContextPtr pxVar18;
  Scope XSoI;
  Scope ASoILocal;
  Scope YSoI;
  Scope ASoI;
  Scope YSoI_1;
  vector<_xmlNode_*,_std::allocator<_xmlNode_*>_> reward_links;
  string child_name;
  string parent_name;
  Scope OSoI;
  Index local_224;
  ParserProbModelXML *local_220;
  Scope local_218;
  Scope local_1f8;
  FactoredDecPOMDPDiscrete *local_1e0;
  undefined1 local_1d8 [32];
  string local_1b8;
  string local_198;
  Scope local_178;
  FactoredDecPOMDPDiscrete *local_158;
  iterator iStack_150;
  pointer local_148;
  string local_138;
  string local_118;
  Scope local_f8;
  TwoStageDynamicBayesianNetwork *local_e0;
  xmlNodeSetPtr local_d8;
  undefined1 local_d0 [16];
  _Base_ptr local_c0 [2];
  undefined1 local_b0 [32];
  xmlXPathObjectPtr local_90;
  vector<Scope,_std::allocator<Scope>_> *local_88;
  vector<Scope,_std::allocator<Scope>_> *local_80;
  Scope local_78;
  Scope local_60;
  Scope local_48;
  
  local_220 = this->_m_parser;
  local_1e0 = this->_m_fDecPOMDP;
  pcVar14 = "/ProbModelXML/ProbNet/Links/Link[@directed=\'true\']";
  local_90 = ParserProbModelXML::GetNodesMatchingExpression
                       (local_220,(xmlChar *)"/ProbModelXML/ProbNet/Links/Link[@directed=\'true\']",
                        (xmlNodePtr)0x0);
  if (local_90 == (xmlXPathObjectPtr)0x0) {
    this_01 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(this_01,"No links were found in target file.");
    __cxa_throw(this_01,&EParse::typeinfo,E::~E);
  }
  pxVar11 = local_90->nodesetval;
  local_158 = (FactoredDecPOMDPDiscrete *)0x0;
  iStack_150._M_current = (_xmlNode **)0x0;
  local_148 = (pointer)0x0;
  if (0 < pxVar11->nodeNr) {
    local_80 = &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn._m_YSoI_O
    ;
    local_88 = &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn._m_YSoI_Y
    ;
    local_e0 = &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn;
    lVar17 = 0;
    local_d8 = pxVar11;
    do {
      this_00 = (ParserProbModelXML *)xmlFirstElementChild(pxVar11->nodeTab[lVar17]);
      pxVar5 = (xmlNodePtr)xmlLastElementChild(pxVar11->nodeTab[lVar17]);
      pPVar15 = (ParserProbModelXML *)&local_118;
      ParserProbModelXML::GetVariableName_abi_cxx11_
                ((string *)pPVar15,(ParserProbModelXML *)pcVar14,(xmlNodePtr)this_00);
      iVar4 = ParserProbModelXML::GetVariableTimeslice(pPVar15,(xmlNodePtr)this_00);
      ParserProbModelXML::GetVariableName_abi_cxx11_(&local_138,this_00,pxVar5);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + (long)(xmlDocPtr *)local_118._M_string_length);
      pVar6 = ParserProbModelXML::GetParsedElement(local_220,(string *)local_b0);
      if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_d0._0_8_ = local_c0;
      pcVar14 = local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)pcVar14,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + (long)(SDT *)local_138._M_string_length);
      pVar7 = ParserProbModelXML::GetParsedElement(local_220,(string *)pcVar14);
      if ((_Base_ptr *)local_d0._0_8_ != local_c0) {
        pcVar14 = (char *)((long)&local_c0[0]->_M_color + 1);
        operator_delete((void *)local_d0._0_8_,(ulong)pcVar14);
      }
      pxVar13 = (xmlXPathContextPtr)((ulong)pVar7 >> 0x20);
      local_198._M_dataplus._M_p = (pointer)0x0;
      local_198._M_string_length = 0;
      local_198.field_2._M_allocated_capacity = 0;
      local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (uint *)0x0;
      local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8._16_8_ = (xmlDocPtr)0x0;
      local_1d8._0_8_ = (_func_int **)0x0;
      local_1d8._8_8_ = (xmlXPathContextPtr)0x0;
      eVar10 = pVar7.first;
      if (eVar10 == STATE) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
                   &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn.
                    _m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)pxVar13].super_SDT);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&local_218.super_SDT,
                   &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn.
                    _m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)pxVar13].super_SDT);
        pvVar8 = local_88;
LAB_0045bdae:
        pcVar14 = (char *)((pvVar8->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
                           super__Vector_impl_data._M_start + (long)pxVar13);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pcVar14);
        pxVar18 = (xmlXPathContextPtr)((ulong)pVar6 >> 0x20);
        IVar16 = pVar6.second;
        if (pVar6.first == ACTION) {
          pcVar14 = (char *)pxVar18;
          if (local_220->_m_asynchronousModel == true) {
            local_1b8._M_dataplus._M_p._0_4_ = IVar16;
            if (local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1f8,
                         (iterator)
                         local_1f8.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint *)&local_1b8);
            }
            else {
              *local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = IVar16;
              local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_1f8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pcVar14 = (char *)0x0;
          }
          IVar16 = (Index)pcVar14;
          bVar3 = Scope::Contains((Scope *)&local_198,IVar16);
          if (!bVar3) {
            local_1b8._M_dataplus._M_p._0_4_ = IVar16;
            if (local_198._M_string_length == local_198.field_2._M_allocated_capacity) {
              pcVar14 = (char *)local_198._M_string_length;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_198,
                         (iterator)local_198._M_string_length,(uint *)&local_1b8);
            }
            else {
              *(Index *)local_198._M_string_length = IVar16;
              pcVar14 = (char *)(local_198._M_string_length + 4);
              local_198._M_string_length = (size_type)pcVar14;
            }
          }
        }
        else if (pVar6.first == STATE) {
          if (iVar4 == 0) {
            bVar3 = Scope::Contains(&local_218,IVar16);
            pcVar14 = (char *)pxVar18;
            if (!bVar3) {
              local_1b8._M_dataplus._M_p._0_4_ = IVar16;
              if (local_218.super_SDT.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_218.super_SDT.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                pcVar14 = (char *)local_218.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_218,
                           (iterator)
                           local_218.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(uint *)&local_1b8);
              }
              else {
                *local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish = IVar16;
                pcVar14 = (char *)(local_218.super_SDT.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 1);
                local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar14;
              }
            }
          }
          else {
            bVar3 = Scope::Contains((Scope *)local_1d8,IVar16);
            pcVar14 = (char *)pxVar18;
            if (!bVar3) {
              local_1b8._M_dataplus._M_p._0_4_ = IVar16;
              if (local_1d8._8_8_ == local_1d8._16_8_) {
                pcVar14 = (char *)local_1d8._8_8_;
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1d8,
                           (iterator)local_1d8._8_8_,(uint *)&local_1b8);
              }
              else {
                *(Index *)local_1d8._8_8_ = IVar16;
                local_1d8._8_8_ = local_1d8._8_8_ + 4;
                pcVar14 = (char *)local_1d8._8_8_;
              }
            }
          }
        }
        IVar16 = pVar7.second;
        if (eVar10 == OBSERVATION) {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          local_1b8.field_2._M_allocated_capacity._0_2_ = 0x3e3c;
          local_1b8._M_string_length = 2;
          local_1b8.field_2._M_local_buf[2] = '\0';
          Scope::Scope(&local_178,&local_1b8);
          pcVar14 = (char *)pxVar13;
          TwoStageDynamicBayesianNetwork::SetSoI_O
                    (local_e0,IVar16,&local_218,(Scope *)&local_198,(Scope *)local_1d8,&local_178);
          if ((_Base_ptr)
              local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            pcVar14 = (char *)((long)local_178.super_SDT.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_178.super_SDT.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_178.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)pcVar14);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            pcVar14 = (char *)(CONCAT53(local_1b8.field_2._M_allocated_capacity._3_5_,
                                        CONCAT12(local_1b8.field_2._M_local_buf[2],
                                                 local_1b8.field_2._M_allocated_capacity._0_2_)) + 1
                              );
            operator_delete(local_1b8._M_dataplus._M_p,(ulong)pcVar14);
          }
          if ((local_220->_m_asynchronousModel == true) &&
             (local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_60.super_SDT,&local_1f8.super_SDT);
            ParserProbModelXML::AddToLocalObsActionScope(local_220,IVar16,&local_60);
            pcVar14 = (char *)pxVar13;
            pSVar1 = (pointer)local_60.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
            pFVar2 = (FactoredDecPOMDPDiscrete *)
                     local_60.super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            goto joined_r0x0045c099;
          }
        }
        else if (((eVar10 == STATE) &&
                 (pcVar14 = (char *)pxVar13,
                 TwoStageDynamicBayesianNetwork::SetSoI_Y
                           (local_e0,IVar16,&local_218,(Scope *)&local_198,(Scope *)local_1d8),
                 local_220->_m_asynchronousModel == true)) &&
                (local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_48.super_SDT,&local_1f8.super_SDT);
          ParserProbModelXML::AddToLocalSFActionScope(local_220,IVar16,&local_48);
          pcVar14 = (char *)pxVar13;
          pSVar1 = (pointer)local_48.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          pFVar2 = (FactoredDecPOMDPDiscrete *)
                   local_48.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0045c099:
          if (pSVar1 != (pointer)0x0) {
            pcVar14 = (char *)((long)pFVar2 - (long)pSVar1);
            operator_delete(pSVar1,(ulong)pcVar14);
          }
        }
      }
      else {
        if (eVar10 == OBSERVATION) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&local_218.super_SDT,
                     &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn.
                      _m_XSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pxVar13].super_SDT);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
                     &(local_1e0->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn.
                      _m_ASoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pxVar13].super_SDT);
          pvVar8 = local_80;
          goto LAB_0045bdae;
        }
        if (eVar10 == REWARD) {
          pcVar14 = (char *)iStack_150._M_current;
          if ((pointer)iStack_150._M_current == local_148) {
            std::vector<_xmlNode*,std::allocator<_xmlNode*>>::_M_realloc_insert<_xmlNode*const&>
                      ((vector<_xmlNode*,std::allocator<_xmlNode*>> *)&local_158,iStack_150,
                       local_d8->nodeTab + lVar17);
          }
          else {
            *iStack_150._M_current = local_d8->nodeTab[lVar17];
            iStack_150._M_current = (_xmlNode **)(iStack_150._M_current + 1);
          }
        }
      }
      if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
        pcVar14 = (char *)(local_1d8._16_8_ + -local_1d8._0_8_);
        operator_delete((void *)local_1d8._0_8_,(ulong)pcVar14);
      }
      if ((xmlXPathContextPtr)
          local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (xmlXPathContextPtr)0x0) {
        pcVar14 = (char *)((long)local_218.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_218.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pcVar14);
      }
      if (local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
        pcVar14 = (char *)((long)local_1f8.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_1f8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pcVar14);
      }
      pxVar11 = local_d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar14 = (char *)(local_198.field_2._M_allocated_capacity -
                          (long)local_198._M_dataplus._M_p);
        operator_delete(local_198._M_dataplus._M_p,(ulong)pcVar14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        pcVar14 = (char *)(local_138.field_2._M_allocated_capacity + 1);
        operator_delete(local_138._M_dataplus._M_p,(ulong)pcVar14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        pcVar14 = (char *)(local_118.field_2._M_allocated_capacity + 1);
        operator_delete(local_118._M_dataplus._M_p,(ulong)pcVar14);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pxVar11->nodeNr);
  }
  if ((FactoredDecPOMDPDiscrete *)iStack_150._M_current != local_158) {
    uVar12 = 0;
    do {
      pxVar13 = (xmlXPathContextPtr)
                xmlFirstElementChild
                          (*(_xmlNode **)
                            ((long)&(local_158->
                                    super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                    super_MultiAgentDecisionProcess.field_0x0 + uVar12 * 8));
      pxVar5 = (xmlNodePtr)
               xmlLastElementChild(*(_xmlNode **)
                                    ((long)&(local_158->
                                            super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                            super_MultiAgentDecisionProcess.field_0x0 + uVar12 * 8))
      ;
      ParserProbModelXML::GetVariableName_abi_cxx11_
                (&local_118,(ParserProbModelXML *)pcVar14,(xmlNodePtr)pxVar13);
      ParserProbModelXML::GetVariableName_abi_cxx11_
                (&local_138,(ParserProbModelXML *)pcVar14,pxVar5);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + (long)(xmlDocPtr *)local_118._M_string_length);
      pVar6 = ParserProbModelXML::GetParsedElement(local_220,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        CONCAT53(local_1b8.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_1b8.field_2._M_local_buf[2],
                                          local_1b8.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + (long)(SDT *)local_138._M_string_length);
      pVar7 = ParserProbModelXML::GetParsedElement(local_220,&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      pxVar18 = (xmlXPathContextPtr)((ulong)pVar7 >> 0x20);
      pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               (**(code **)(*(long *)&(local_1e0->
                                      super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                      super_MultiAgentDecisionProcess + 0x288))(local_1e0,pxVar18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1f8.super_SDT,pvVar9);
      local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               (**(code **)(*(long *)&(local_1e0->
                                      super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                      super_MultiAgentDecisionProcess + 0x280))(local_1e0,pxVar18);
      pPVar15 = (ParserProbModelXML *)local_1d8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pPVar15,pvVar9);
      local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar4 = ParserProbModelXML::GetVariableTimeslice(pPVar15,(xmlNodePtr)pxVar13);
      IVar16 = pVar6.second;
      eVar10 = pVar6.first;
      if (iVar4 == 0) {
        if (eVar10 == STATE) {
          bVar3 = Scope::Contains((Scope *)local_1d8,IVar16);
          if (!bVar3) {
            if (local_1d8._8_8_ == local_1d8._16_8_) {
              local_224 = IVar16;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1d8,
                         (iterator)local_1d8._8_8_,&local_224);
            }
            else {
              *(Index *)local_1d8._8_8_ = IVar16;
              local_1d8._8_8_ = local_1d8._8_8_ + 4;
              local_224 = IVar16;
            }
          }
        }
        else {
          if (eVar10 != ACTION) goto LAB_0045c514;
          if (local_220->_m_asynchronousModel == true) {
            if (local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_224 = IVar16;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_218,
                         (iterator)
                         local_218.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_224);
            }
            else {
              *local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = IVar16;
              local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_218.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              local_224 = IVar16;
            }
            IVar16 = 0;
          }
          bVar3 = Scope::Contains(&local_1f8,IVar16);
          if (!bVar3) {
            local_224 = IVar16;
            if (local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1f8,
                         (iterator)
                         local_1f8.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_224);
            }
            else {
              *local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = IVar16;
              local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_1f8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
LAB_0045c48f:
        pxVar13 = pxVar18;
        FactoredDecPOMDPDiscrete::SetScopeForLRF
                  (local_1e0,pVar7.second,(Scope *)local_1d8,&local_1f8,&local_178,&local_f8);
        if ((local_220->_m_asynchronousModel == true) &&
           (local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_78.super_SDT,&local_218.super_SDT);
          ParserProbModelXML::AddToLocalLRFActionScope(local_220,pVar7.second,&local_78);
          pxVar13 = pxVar18;
          if ((_Base_ptr)
              local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            pxVar13 = (xmlXPathContextPtr)
                      ((long)local_78.super_SDT.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
            operator_delete(local_78.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)pxVar13);
          }
        }
      }
      else {
        if (eVar10 == OBSERVATION) {
          if (local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_224 = IVar16;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                       (iterator)
                       local_f8.super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_224);
          }
          else {
            *local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish = IVar16;
            local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            local_224 = IVar16;
          }
          goto LAB_0045c48f;
        }
        if (eVar10 == STATE) {
          if (local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_224 = IVar16;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_178,
                       (iterator)
                       local_178.super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_224);
          }
          else {
            *local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish = IVar16;
            local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_224 = IVar16;
          }
          goto LAB_0045c48f;
        }
      }
LAB_0045c514:
      pcVar14 = (char *)pxVar13;
      if ((pointer)local_f8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar14 = (char *)((long)local_f8.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_f8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pcVar14);
      }
      if ((_Base_ptr)
          local_178.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
        pcVar14 = (char *)((long)local_178.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_178.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pcVar14);
      }
      if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
        pcVar14 = (char *)(local_1d8._16_8_ + -local_1d8._0_8_);
        operator_delete((void *)local_1d8._0_8_,(ulong)pcVar14);
      }
      if ((xmlXPathContextPtr)
          local_218.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (xmlXPathContextPtr)0x0) {
        pcVar14 = (char *)((long)local_218.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_218.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pcVar14);
      }
      if (local_1f8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
        pcVar14 = (char *)((long)local_1f8.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_1f8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pcVar14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        pcVar14 = (char *)(local_138.field_2._M_allocated_capacity + 1);
        operator_delete(local_138._M_dataplus._M_p,(ulong)pcVar14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        pcVar14 = (char *)(local_118.field_2._M_allocated_capacity + 1);
        operator_delete(local_118._M_dataplus._M_p,(ulong)pcVar14);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_150._M_current - (long)local_158 >> 3));
  }
  xmlXPathFreeObject(local_90);
  if (local_158 != (FactoredDecPOMDPDiscrete *)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  return;
}

Assistant:

void operator()(){SetScopes(_m_parser,_m_fDecPOMDP);}